

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

int __thiscall Fl_Text_Buffer::count_lines(Fl_Text_Buffer *this,int startPos,int endPos)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = (long)startPos;
  iVar2 = 0;
  while( true ) {
    if (this->mGapStart <= lVar3) {
      for (; (endPos != lVar3 && (lVar3 < this->mLength)); lVar3 = lVar3 + 1) {
        iVar2 = iVar2 + (uint)(this->mBuf[lVar3 + (this->mGapEnd - this->mGapStart)] == '\n');
      }
      return iVar2;
    }
    if (endPos == lVar3) break;
    pcVar1 = this->mBuf + lVar3;
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + (uint)(*pcVar1 == '\n');
  }
  return iVar2;
}

Assistant:

int Fl_Text_Buffer::count_lines(int startPos, int endPos) const {
  IS_UTF8_ALIGNED2(this, (startPos))
  IS_UTF8_ALIGNED2(this, (endPos))
  
  int gapLen = mGapEnd - mGapStart;
  int lineCount = 0;
  
  int pos = startPos;
  while (pos < mGapStart)
  {
    if (pos == endPos)
      return lineCount;
    if (mBuf[pos++] == '\n')
      lineCount++;
  } 
  while (pos < mLength) {
    if (pos == endPos)
      return lineCount;
    if (mBuf[pos++ + gapLen] == '\n')
      lineCount++;
  }
  return lineCount;
}